

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderPrimitiveCounter::iterate(GeometryShaderPrimitiveCounter *this)

{
  bool bVar1;
  GLint *feedbackResult;
  NotSupportedError *this_00;
  char *description;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    createAndBuildProgramWithFeedback(this);
    prepareBufferObjects(this);
    feedbackResult = (GLint *)operator_new__((ulong)this->m_sizeOfFeedbackBuffer << 2);
    drawAndGetFeedback(this,feedbackResult);
    bVar1 = checkResult(this,feedbackResult);
    if (!bVar1) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,
               description);
    operator_delete__(feedbackResult);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
             ,0x30a);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderPrimitiveCounter::iterate(void)
{
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up */
	glw::GLint* feedbackResult = NULL;

	createAndBuildProgramWithFeedback();
	prepareBufferObjects();

	feedbackResult = new glw::GLint[m_sizeOfFeedbackBuffer];

	/* Execute the test */
	drawAndGetFeedback(feedbackResult);

	/* Set the CTS test result, depending on the outcome */
	if (checkResult(feedbackResult))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	if (feedbackResult != NULL)
	{
		delete[] feedbackResult;

		feedbackResult = DE_NULL;
	}

	return STOP;
}